

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

string * __thiscall
cmQtAutoMocUic::AbsoluteIncludePath
          (string *__return_storage_ptr__,cmQtAutoMocUic *this,string *relativePath)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(this->BaseConst_).AutogenIncludeDir);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoMocUic::AbsoluteIncludePath(
  std::string const& relativePath) const
{
  std::string res(BaseConst().AutogenIncludeDir);
  res += '/';
  res += relativePath;
  return res;
}